

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

wasm_module_t * wasm_module_new(wasm_store_t *store,wasm_byte_vec_t *binary)

{
  wasm_byte_t *data;
  size_t size;
  FILE *file;
  bool bVar1;
  ModuleDesc local_2e0;
  Ptr local_1c0;
  undefined4 local_1a4;
  string local_1a0;
  ReadBinaryOptions local_180;
  Enum local_15c;
  undefined1 local_158 [8];
  ModuleDesc module_desc;
  Errors errors;
  wasm_byte_vec_t *binary_local;
  wasm_store_t *store_local;
  
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
             &module_desc.istream.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  wabt::interp::ModuleDesc::ModuleDesc((ModuleDesc *)local_158);
  data = binary->data;
  size = binary->size;
  GetOptions();
  local_15c = (Enum)wabt::interp::ReadBinaryInterp
                              (data,size,&local_180,
                               (Errors *)
                               &module_desc.istream.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ModuleDesc *)local_158);
  bVar1 = wabt::Failed((Result)local_15c);
  file = _stderr;
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_1a0);
    wabt::FormatErrorsToFile
              ((Errors *)
               &module_desc.istream.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,Binary,(LexerSourceLineFinder *)0x0,file,
               &local_1a0,Never,0x50);
    std::__cxx11::string::~string((string *)&local_1a0);
    store_local = (wasm_store_t *)0x0;
  }
  else {
    store_local = (wasm_store_t *)operator_new(0x28);
    wabt::interp::ModuleDesc::ModuleDesc(&local_2e0,(ModuleDesc *)local_158);
    wabt::interp::Module::New(&local_1c0,&store->I,&local_2e0);
    wasm_module_t::wasm_module_t((wasm_module_t *)store_local,&local_1c0,binary);
    wabt::interp::RefPtr<wabt::interp::Module>::~RefPtr(&local_1c0);
    wabt::interp::ModuleDesc::~ModuleDesc(&local_2e0);
  }
  local_1a4 = 1;
  wabt::interp::ModuleDesc::~ModuleDesc((ModuleDesc *)local_158);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
             &module_desc.istream.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return (wasm_module_t *)store_local;
}

Assistant:

own wasm_module_t* wasm_module_new(wasm_store_t* store,
                                   const wasm_byte_vec_t* binary) {
  Errors errors;
  ModuleDesc module_desc;
  if (Failed(ReadBinaryInterp(binary->data, binary->size, GetOptions(), &errors,
                              &module_desc))) {
    FormatErrorsToFile(errors, Location::Type::Binary);
    return nullptr;
  }

  return new wasm_module_t{Module::New(store->I, module_desc), binary};
}